

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall sector_t::FindLowestFloorSurrounding(sector_t *this,vertex_t **v)

{
  secplane_t *this_00;
  line_t *line;
  sector_t *psVar1;
  long lVar2;
  vertex_t *v_00;
  double dVar3;
  double dVar4;
  double local_48;
  
  if (this->linecount == 0) {
    local_48 = this->planes[0].TexZ;
  }
  else {
    v_00 = (*this->lines)->v1;
    this_00 = &this->floorplane;
    local_48 = secplane_t::ZatPoint(this_00,v_00);
    for (lVar2 = 0; lVar2 < this->linecount; lVar2 = lVar2 + 1) {
      line = this->lines[lVar2];
      psVar1 = getNextSector(line,this);
      if (psVar1 != (sector_t *)0x0) {
        dVar3 = secplane_t::ZatPoint(&psVar1->floorplane,line->v1);
        if ((dVar3 < local_48) && (dVar4 = secplane_t::ZatPoint(this_00,line->v1), dVar3 < dVar4)) {
          v_00 = line->v1;
          local_48 = dVar3;
        }
        dVar3 = secplane_t::ZatPoint(&psVar1->floorplane,line->v2);
        if ((dVar3 < local_48) && (dVar4 = secplane_t::ZatPoint(this_00,line->v2), dVar3 < dVar4)) {
          v_00 = line->v2;
          local_48 = dVar3;
        }
      }
    }
    if (v != (vertex_t **)0x0) {
      *v = v_00;
    }
  }
  return local_48;
}

Assistant:

double sector_t::FindLowestFloorSurrounding (vertex_t **v) const
{
	int i;
	sector_t *other;
	line_t *check;
	double floor;
	double ofloor;
	vertex_t *spot;

	if (linecount == 0) return GetPlaneTexZ(sector_t::floor);

	spot = lines[0]->v1;
	floor = floorplane.ZatPoint(spot);

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			ofloor = other->floorplane.ZatPoint (check->v1);
			if (ofloor < floor && ofloor < floorplane.ZatPoint (check->v1))
			{
				floor = ofloor;
				spot = check->v1;
			}
			ofloor = other->floorplane.ZatPoint (check->v2);
			if (ofloor < floor && ofloor < floorplane.ZatPoint (check->v2))
			{
				floor = ofloor;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return floor;
}